

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void CVmImageLoader::load_resources_from_fp(osfildef *fp,char *fname,CVmImageLoaderMres *res_ifc)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  CVmFile *this;
  undefined8 *puVar3;
  long *plVar4;
  CVmImageLoader *loader;
  CVmImageFile *imagefp;
  err_frame_t err_cur__;
  
  imagefp = (CVmImageFile *)0x0;
  loader = (CVmImageLoader *)0x0;
  this = (CVmFile *)operator_new(0x10);
  this->fp_ = fp;
  this->seek_base_ = 0;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    imagefp = (CVmImageFile *)operator_new(0x20);
    imagefp->_vptr_CVmImageFile = (_func_int **)&PTR__CVmImageFileExt_0035f3f8;
    imagefp[1]._vptr_CVmImageFile = (_func_int **)this;
    imagefp[2]._vptr_CVmImageFile = (_func_int **)0x0;
    imagefp[3]._vptr_CVmImageFile = (_func_int **)0x0;
    loader = (CVmImageLoader *)operator_new(0x98);
    CVmImageLoader(loader,imagefp,fname,0);
    load_resource_file(loader,res_ifc);
  }
  if (-1 < (short)err_cur__.state_) {
    this->fp_ = (osfildef *)0x0;
    err_cur__.state_ = err_cur__.state_ | 0x8000;
    if (loader != (CVmImageLoader *)0x0) {
      if (loader != (CVmImageLoader *)0x0) {
        ~CVmImageLoader(loader);
      }
      operator_delete(loader,0x98);
    }
    if ((imagefp != (CVmImageFile *)0x0) && (imagefp != (CVmImageFile *)0x0)) {
      (*imagefp->_vptr_CVmImageFile[1])();
    }
    CVmFile::~CVmFile(this);
    operator_delete(this,0x10);
  }
  peVar1 = err_cur__.prv_;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = peVar1;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    pCVar2 = err_cur__.exc_;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar4 + 0x10) = pCVar2;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  return;
}

Assistant:

void CVmImageLoader::load_resources_from_fp(osfildef *fp,
                                            const char *fname,
                                            CVmImageLoaderMres *res_ifc)
{
    CVmFile *file;
    CVmImageFile *volatile imagefp = 0;
    CVmImageLoader *volatile loader = 0;

    /* create a file object for reading the file */
    file = new CVmFile();

    /* set up the file with our file handler */
    file->set_file(fp, 0);
    
    err_try
    {
        /* set up the loader */
        imagefp = new CVmImageFileExt(file);
        loader = new CVmImageLoader(imagefp, fname, 0);

        /* load the resource-only file */
        loader->load_resource_file(res_ifc);
    }